

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fkScanChildren(Parse *pParse,SrcList *pSrc,Table *pTab,Index *pIdx,FKey *pFKey,int *aiCol,
                   int regData,int nIncr)

{
  i16 iCol_00;
  short iCol_01;
  sqlite3 *db_00;
  Vdbe *p;
  Expr *pEVar1;
  Expr *pEVar2;
  WhereInfo *pWInfo_00;
  short local_fc;
  Expr *pEStack_f0;
  i16 iCol_1;
  Expr *pAll;
  Expr *pEq_1;
  Expr *pRight_1;
  Expr *pLeft_1;
  Expr *pNe;
  char *zCol;
  i16 iCol;
  Expr *pEq;
  Expr *pRight;
  Expr *pLeft;
  Vdbe *v;
  int iFkIfZero;
  WhereInfo *pWInfo;
  NameContext sNameContext;
  Expr *pWhere;
  int i;
  sqlite3 *db;
  int *aiCol_local;
  FKey *pFKey_local;
  Index *pIdx_local;
  Table *pTab_local;
  SrcList *pSrc_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  sNameContext.pWinSelect = (Select *)0x0;
  v._4_4_ = 0;
  p = sqlite3GetVdbe(pParse);
  if (nIncr < 0) {
    v._4_4_ = sqlite3VdbeAddOp2(p,0x2e,(uint)pFKey->isDeferred,0);
  }
  for (pWhere._4_4_ = 0; pWhere._4_4_ < pFKey->nCol; pWhere._4_4_ = pWhere._4_4_ + 1) {
    if (pIdx == (Index *)0x0) {
      iCol_00 = -1;
    }
    else {
      iCol_00 = pIdx->aiColumn[pWhere._4_4_];
    }
    pEVar1 = exprTableRegister(pParse,pTab,regData,iCol_00);
    if (aiCol == (int *)0x0) {
      local_fc = (short)pFKey->aCol[0].iFrom;
    }
    else {
      local_fc = (short)aiCol[pWhere._4_4_];
    }
    pEVar2 = sqlite3Expr(db_00,0x3b,pFKey->pFrom->aCol[local_fc].zName);
    pEVar1 = sqlite3PExpr(pParse,0x35,pEVar1,pEVar2);
    sNameContext.pWinSelect = (Select *)sqlite3ExprAnd(db_00,(Expr *)sNameContext.pWinSelect,pEVar1)
    ;
  }
  if ((pTab == pFKey->pFrom) && (0 < nIncr)) {
    if ((pTab->tabFlags & 0x20) == 0) {
      pEVar1 = exprTableRegister(pParse,pTab,regData,-1);
      pEVar2 = exprTableColumn(db_00,pTab,pSrc->a[0].iCursor,-1);
      pLeft_1 = sqlite3PExpr(pParse,0x34,pEVar1,pEVar2);
    }
    else {
      pEStack_f0 = (Expr *)0x0;
      for (pWhere._4_4_ = 0; pWhere._4_4_ < (int)(uint)pIdx->nKeyCol;
          pWhere._4_4_ = pWhere._4_4_ + 1) {
        iCol_01 = pIdx->aiColumn[pWhere._4_4_];
        pEVar1 = exprTableRegister(pParse,pTab,regData,iCol_01);
        pEVar2 = sqlite3Expr(db_00,0x3b,pTab->aCol[iCol_01].zName);
        pEVar1 = sqlite3PExpr(pParse,0x2d,pEVar1,pEVar2);
        pEStack_f0 = sqlite3ExprAnd(db_00,pEStack_f0,pEVar1);
      }
      pLeft_1 = sqlite3PExpr(pParse,0x13,pEStack_f0,(Expr *)0x0);
    }
    sNameContext.pWinSelect =
         (Select *)sqlite3ExprAnd(db_00,(Expr *)sNameContext.pWinSelect,pLeft_1);
  }
  memset(&pWInfo,0,0x38);
  pWInfo = (WhereInfo *)pParse;
  sNameContext.pParse = (Parse *)pSrc;
  sqlite3ResolveExprNames((NameContext *)&pWInfo,(Expr *)sNameContext.pWinSelect);
  if (pParse->nErr == 0) {
    pWInfo_00 = sqlite3WhereBegin(pParse,pSrc,(Expr *)sNameContext.pWinSelect,(ExprList *)0x0,
                                  (ExprList *)0x0,0,0);
    sqlite3VdbeAddOp2(p,0x96,(uint)pFKey->isDeferred,nIncr);
    if (pWInfo_00 != (WhereInfo *)0x0) {
      sqlite3WhereEnd(pWInfo_00);
    }
  }
  sqlite3ExprDelete(db_00,(Expr *)sNameContext.pWinSelect);
  if (v._4_4_ != 0) {
    sqlite3VdbeJumpHere(p,v._4_4_);
  }
  return;
}

Assistant:

static void fkScanChildren(
  Parse *pParse,                  /* Parse context */
  SrcList *pSrc,                  /* The child table to be scanned */
  Table *pTab,                    /* The parent table */
  Index *pIdx,                    /* Index on parent covering the foreign key */
  FKey *pFKey,                    /* The foreign key linking pSrc to pTab */
  int *aiCol,                     /* Map from pIdx cols to child table cols */
  int regData,                    /* Parent row data starts here */
  int nIncr                       /* Amount to increment deferred counter by */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  int i;                          /* Iterator variable */
  Expr *pWhere = 0;               /* WHERE clause to scan with */
  NameContext sNameContext;       /* Context used to resolve WHERE clause */
  WhereInfo *pWInfo;              /* Context used by sqlite3WhereXXX() */
  int iFkIfZero = 0;              /* Address of OP_FkIfZero */
  Vdbe *v = sqlite3GetVdbe(pParse);

  assert( pIdx==0 || pIdx->pTable==pTab );
  assert( pIdx==0 || pIdx->nKeyCol==pFKey->nCol );
  assert( pIdx!=0 || pFKey->nCol==1 );
  assert( pIdx!=0 || HasRowid(pTab) );

  if( nIncr<0 ){
    iFkIfZero = sqlite3VdbeAddOp2(v, OP_FkIfZero, pFKey->isDeferred, 0);
    VdbeCoverage(v);
  }

  /* Create an Expr object representing an SQL expression like:
  **
  **   <parent-key1> = <child-key1> AND <parent-key2> = <child-key2> ...
  **
  ** The collation sequence used for the comparison should be that of
  ** the parent key columns. The affinity of the parent key column should
  ** be applied to each child key value before the comparison takes place.
  */
  for(i=0; i<pFKey->nCol; i++){
    Expr *pLeft;                  /* Value from parent table row */
    Expr *pRight;                 /* Column ref to child table */
    Expr *pEq;                    /* Expression (pLeft = pRight) */
    i16 iCol;                     /* Index of column in child table */ 
    const char *zCol;             /* Name of column in child table */

    iCol = pIdx ? pIdx->aiColumn[i] : -1;
    pLeft = exprTableRegister(pParse, pTab, regData, iCol);
    iCol = aiCol ? aiCol[i] : pFKey->aCol[0].iFrom;
    assert( iCol>=0 );
    zCol = pFKey->pFrom->aCol[iCol].zName;
    pRight = sqlite3Expr(db, TK_ID, zCol);
    pEq = sqlite3PExpr(pParse, TK_EQ, pLeft, pRight);
    pWhere = sqlite3ExprAnd(db, pWhere, pEq);
  }

  /* If the child table is the same as the parent table, then add terms
  ** to the WHERE clause that prevent this entry from being scanned.
  ** The added WHERE clause terms are like this:
  **
  **     $current_rowid!=rowid
  **     NOT( $current_a==a AND $current_b==b AND ... )
  **
  ** The first form is used for rowid tables.  The second form is used
  ** for WITHOUT ROWID tables. In the second form, the *parent* key is
  ** (a,b,...). Either the parent or primary key could be used to 
  ** uniquely identify the current row, but the parent key is more convenient
  ** as the required values have already been loaded into registers
  ** by the caller.
  */
  if( pTab==pFKey->pFrom && nIncr>0 ){
    Expr *pNe;                    /* Expression (pLeft != pRight) */
    Expr *pLeft;                  /* Value from parent table row */
    Expr *pRight;                 /* Column ref to child table */
    if( HasRowid(pTab) ){
      pLeft = exprTableRegister(pParse, pTab, regData, -1);
      pRight = exprTableColumn(db, pTab, pSrc->a[0].iCursor, -1);
      pNe = sqlite3PExpr(pParse, TK_NE, pLeft, pRight);
    }else{
      Expr *pEq, *pAll = 0;
      assert( pIdx!=0 );
      for(i=0; i<pIdx->nKeyCol; i++){
        i16 iCol = pIdx->aiColumn[i];
        assert( iCol>=0 );
        pLeft = exprTableRegister(pParse, pTab, regData, iCol);
        pRight = sqlite3Expr(db, TK_ID, pTab->aCol[iCol].zName);
        pEq = sqlite3PExpr(pParse, TK_IS, pLeft, pRight);
        pAll = sqlite3ExprAnd(db, pAll, pEq);
      }
      pNe = sqlite3PExpr(pParse, TK_NOT, pAll, 0);
    }
    pWhere = sqlite3ExprAnd(db, pWhere, pNe);
  }

  /* Resolve the references in the WHERE clause. */
  memset(&sNameContext, 0, sizeof(NameContext));
  sNameContext.pSrcList = pSrc;
  sNameContext.pParse = pParse;
  sqlite3ResolveExprNames(&sNameContext, pWhere);

  /* Create VDBE to loop through the entries in pSrc that match the WHERE
  ** clause. For each row found, increment either the deferred or immediate
  ** foreign key constraint counter. */
  if( pParse->nErr==0 ){
    pWInfo = sqlite3WhereBegin(pParse, pSrc, pWhere, 0, 0, 0, 0);
    sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, nIncr);
    if( pWInfo ){
      sqlite3WhereEnd(pWInfo);
    }
  }

  /* Clean up the WHERE clause constructed above. */
  sqlite3ExprDelete(db, pWhere);
  if( iFkIfZero ){
    sqlite3VdbeJumpHere(v, iFkIfZero);
  }
}